

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O0

bool slang::parsing::isBinaryOrPostfixExpression(TokenKind kind)

{
  SyntaxKind SVar1;
  TokenKind in_DI;
  bool local_1;
  
  if ((((in_DI == Apostrophe) || (in_DI == OpenParenthesis)) || (in_DI == Dot)) ||
     ((in_DI == Question || (in_DI == DistKeyword)))) {
    local_1 = true;
  }
  else {
    SVar1 = slang::syntax::SyntaxFacts::getBinaryExpression(in_DI);
    local_1 = SVar1 != Unknown;
  }
  return local_1;
}

Assistant:

static bool isBinaryOrPostfixExpression(TokenKind kind) {
    // NOTE: This deliberately does not include the open bracket because
    // this function is only called on tokens that occur right after a
    // parenthesized expression ends, in a sequence or property context.
    // In those places, an open bracket means something else.
    switch (kind) {
        case TokenKind::Dot:
        case TokenKind::OpenParenthesis:
        case TokenKind::Apostrophe:
        case TokenKind::DistKeyword:
        case TokenKind::Question:
            return true;
        default:
            return SyntaxFacts::getBinaryExpression(kind) != SyntaxKind::Unknown;
    }
}